

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

ui_event textui_get_command(int *count)

{
  _Bool _Var1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  undefined8 extraout_RDX;
  ui_event uVar5;
  keypress kc;
  undefined1 local_98;
  long local_90;
  size_t n;
  undefined1 local_80;
  wchar_t c;
  _Bool keymap_ok;
  ui_event_type local_68;
  keypress *local_50;
  keypress *act;
  keypress tmp [2];
  wchar_t mode;
  int *count_local;
  uint uStack_10;
  ui_event ke;
  
  _Var1 = (player->opts).opt[1];
  memset(&act,0,0x18);
  stack0xffffffffffffffec = (keypress *)0x0;
  ke.type = EVT_NONE;
  local_50 = (keypress *)0x0;
LAB_0022c93b:
  msg_flag = false;
  inkey_flag = true;
  if (((player->opts).opt[9] & 1U) != 0) {
    Term_set_cursor(true);
    move_cursor_relative((player->grid).y,(player->grid).x);
  }
  uVar5 = inkey_ex();
  register0x00000000 = uVar5._0_8_;
  local_68 = CONCAT31(local_68._1_3_,uVar5.key.mods);
  ke.type = local_68;
  if (((player->opts).opt[9] & 1U) != 0) {
    Term_set_cursor(false);
  }
  if (count_local._4_4_ != 1) goto LAB_0022cae5;
  bVar2 = true;
  if (uStack_10 == 0x30) {
    if ((ke.type & EVT_ESCAPE) != EVT_NONE) goto LAB_0022cabb;
    wVar4 = textui_get_count();
    if ((wVar4 == L'\xffffffff') ||
       (_Var3 = get_com_ex("Command: ",(ui_event *)((long)&count_local + 4)), !_Var3))
    goto LAB_0022c93b;
    *count = wVar4;
  }
  else {
    if (uStack_10 == 0x5c) {
      get_com_ex("Command: ",(ui_event *)((long)&count_local + 4));
      bVar2 = false;
      goto LAB_0022cabb;
    }
    if (uStack_10 != 0x5e) goto LAB_0022cabb;
    _Var3 = get_com_ex("Control: ",(ui_event *)((long)&count_local + 4));
    if ((!_Var3) || (count_local._4_4_ != 1)) goto LAB_0022c93b;
    if (((uStack_10 < 0x40) || (0x5f < uStack_10)) && ((uStack_10 < 0x61 || (0x7a < uStack_10)))) {
      ke.type = ke.type | EVT_KBRD;
    }
    else {
      stack0xffffffffffffffec = (keypress *)((ulong)stack0xffffffffffffffec & 0x1fffffffff);
    }
  }
LAB_0022cabb:
  if (bVar2) {
    local_80 = (undefined1)ke.type;
    kc.mods = local_80;
    kc._0_8_ = stack0xffffffffffffffec;
    kc._9_3_ = 0;
    local_50 = keymap_find((uint)((_Var1 & 1U) != 0),kc);
  }
LAB_0022cae5:
  prt("",L'\0',L'\0');
  if (count_local._4_4_ == 8) {
    local_50 = (keypress *)&act;
    act = stack0xffffffffffffffec;
    tmp[0].type = ke.type;
  }
  if (((uStack_10 == 0) || (local_50 == (keypress *)0x0)) || (inkey_next != (keypress *)0x0)) {
    local_98 = (undefined1)ke.type;
    uVar5._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_98);
    uVar5.mouse = (mouseclick)stack0xffffffffffffffec;
    return uVar5;
  }
  for (local_90 = 0; local_50[local_90].type != EVT_NONE; local_90 = local_90 + 1) {
  }
  memcpy(request_command_buffer,local_50,(local_90 + 1) * 0xc);
  inkey_next = request_command_buffer;
  goto LAB_0022c93b;
}

Assistant:

ui_event textui_get_command(int *count)
{
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	struct keypress tmp[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

	ui_event ke = EVENT_EMPTY;

	const struct keypress *act = NULL;



	/* Get command */
	while (1) {
		/* Hack -- no flush needed */
		msg_flag = false;

		/* Activate "command mode" */
		inkey_flag = true;

		/* Toggle on cursor if requested */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(true);
			move_cursor_relative(player->grid.y, player->grid.x);
		}

		/* Get a command */
		ke = inkey_ex();

		/* Toggle off cursor */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(false);
		}

		if (ke.type == EVT_KBRD) {
			bool keymap_ok = true;
			switch (ke.key.code) {
				case '0': {
					if(ke.key.mods & KC_MOD_KEYPAD) break;

					int c = textui_get_count();

					if (c == -1 || !get_com_ex("Command: ", &ke))
						continue;
					else
						*count = c;
					break;
				}

				case '\\': {
					/* Allow keymaps to be bypassed */
					(void)get_com_ex("Command: ", &ke);
					keymap_ok = false;
					break;
				}

				case '^': {
					/* Allow "control chars" to be entered */
					if (!get_com_ex("Control: ", &ke)
							|| ke.type != EVT_KBRD) {
						continue;
					}
					if (ENCODE_KTRL(ke.key.code)) {
						ke.key.code = KTRL(ke.key.code);
					} else {
						ke.key.mods |= KC_MOD_CONTROL;
					}
					break;
				}
			}

			/* Find any relevant keymap */
			if (keymap_ok)
				act = keymap_find(mode, ke.key);
		}

		/* Erase the message line */
		prt("", 0, 0);

		if (ke.type == EVT_BUTTON) {
			/* Buttons are always specified in standard keyset */
			act = tmp;
			tmp[0] = ke.key;
		}

		/* Apply keymap if not inside a keymap already */
		if (ke.key.code && act && !inkey_next) {
			size_t n = 0;
			while (act[n].type)
				n++;

			/* Make room for the terminator */
			n += 1;

			/* Install the keymap */
			memcpy(request_command_buffer, act, n * sizeof(struct keypress));

			/* Start using the buffer */
			inkey_next = request_command_buffer;

			/* Continue */
			continue;
		}

		/* Done */
		break;
	}

	return ke;
}